

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TreePatterns.cpp
# Opt level: O0

bool __thiscall
IRT::RegMinusRegPattern::TryToGenerateCode
          (RegMinusRegPattern *this,INode *tree,CTemp *dest,ChildrenTemps *children,
          AssemblyCommands *commands)

{
  ConstBinopPtr pCVar1;
  AssemblyCommands *pAVar2;
  ChildrenTemps *pCVar3;
  TOperationType TVar4;
  CExpression *pCVar5;
  CTempExpression *local_1f0;
  CTempExpression *local_1b0;
  ConstTempPtr local_1a0;
  undefined1 local_190 [16];
  CExpression *local_180;
  pair<IRT::CTemp,_const_IRT::CExpression_*> local_178;
  pair<IRT::CTemp,_const_IRT::INode_*> local_150;
  undefined1 local_128 [8];
  CTemp rightRegister;
  ConstTempPtr rightRegisterPtr;
  CExpression *local_e0;
  pair<IRT::CTemp,_const_IRT::CExpression_*> local_d8;
  pair<IRT::CTemp,_const_IRT::INode_*> local_b0;
  undefined1 local_88 [8];
  CTemp leftRegister;
  undefined1 local_58 [24];
  ConstTempPtr leftRegisterPtr;
  ConstBinopPtr binopPtr;
  AssemblyCommands *commands_local;
  ChildrenTemps *children_local;
  CTemp *dest_local;
  INode *tree_local;
  RegMinusRegPattern *this_local;
  
  binopPtr = (ConstBinopPtr)commands;
  commands_local = (AssemblyCommands *)children;
  children_local = (ChildrenTemps *)dest;
  dest_local = (CTemp *)tree;
  tree_local = (INode *)this;
  if (tree == (INode *)0x0) {
    local_1a0 = (ConstTempPtr)0x0;
  }
  else {
    local_1a0 = (ConstTempPtr)__dynamic_cast(tree,&INode::typeinfo,&CBinopExpression::typeinfo,0);
  }
  leftRegisterPtr = local_1a0;
  if ((local_1a0 != (ConstTempPtr)0x0) &&
     (TVar4 = CBinopExpression::getOperation((CBinopExpression *)local_1a0), TVar4 == MINUS)) {
    pCVar5 = CBinopExpression::getLeftOperand((CBinopExpression *)leftRegisterPtr);
    if (pCVar5 == (CExpression *)0x0) {
      local_1b0 = (CTempExpression *)0x0;
    }
    else {
      local_1b0 = (CTempExpression *)
                  __dynamic_cast(pCVar5,&CExpression::typeinfo,&CTempExpression::typeinfo,0);
    }
    pCVar3 = children_local;
    pCVar1 = binopPtr;
    local_58._16_8_ = local_1b0;
    if (local_1b0 == (CTempExpression *)0x0) {
      CTemp::CTemp((CTemp *)local_88);
      pAVar2 = commands_local;
      local_e0 = CBinopExpression::getLeftOperand((CBinopExpression *)leftRegisterPtr);
      std::make_pair<IRT::CTemp&,IRT::CExpression_const*>(&local_d8,(CTemp *)local_88,&local_e0);
      std::pair<IRT::CTemp,_const_IRT::INode_*>::pair<IRT::CTemp,_const_IRT::CExpression_*,_true>
                (&local_b0,&local_d8);
      std::
      vector<std::pair<IRT::CTemp,_const_IRT::INode_*>,_std::allocator<std::pair<IRT::CTemp,_const_IRT::INode_*>_>_>
      ::push_back((vector<std::pair<IRT::CTemp,_const_IRT::INode_*>,_std::allocator<std::pair<IRT::CTemp,_const_IRT::INode_*>_>_>
                   *)pAVar2,&local_b0);
      std::pair<IRT::CTemp,_const_IRT::INode_*>::~pair(&local_b0);
      std::pair<IRT::CTemp,_const_IRT::CExpression_*>::~pair(&local_d8);
      pCVar1 = binopPtr;
      std::make_shared<AssemblyCode::MoveRegRegCommand,IRT::CTemp_const&,IRT::CTemp&>
                ((CTemp *)&rightRegisterPtr,(CTemp *)children_local);
      std::
      vector<std::shared_ptr<AssemblyCode::AssemblyCommand>,std::allocator<std::shared_ptr<AssemblyCode::AssemblyCommand>>>
      ::emplace_back<std::shared_ptr<AssemblyCode::MoveRegRegCommand>>
                ((vector<std::shared_ptr<AssemblyCode::AssemblyCommand>,std::allocator<std::shared_ptr<AssemblyCode::AssemblyCommand>>>
                  *)pCVar1,(shared_ptr<AssemblyCode::MoveRegRegCommand> *)&rightRegisterPtr);
      std::shared_ptr<AssemblyCode::MoveRegRegCommand>::~shared_ptr
                ((shared_ptr<AssemblyCode::MoveRegRegCommand> *)&rightRegisterPtr);
      CTemp::~CTemp((CTemp *)local_88);
    }
    else {
      CTempExpression::getTemprorary(local_1b0);
      std::make_shared<AssemblyCode::MoveRegRegCommand,IRT::CTemp_const&,IRT::CTemp_const&>
                ((CTemp *)local_58,(CTemp *)pCVar3);
      std::
      vector<std::shared_ptr<AssemblyCode::AssemblyCommand>,std::allocator<std::shared_ptr<AssemblyCode::AssemblyCommand>>>
      ::emplace_back<std::shared_ptr<AssemblyCode::MoveRegRegCommand>>
                ((vector<std::shared_ptr<AssemblyCode::AssemblyCommand>,std::allocator<std::shared_ptr<AssemblyCode::AssemblyCommand>>>
                  *)pCVar1,(shared_ptr<AssemblyCode::MoveRegRegCommand> *)local_58);
      std::shared_ptr<AssemblyCode::MoveRegRegCommand>::~shared_ptr
                ((shared_ptr<AssemblyCode::MoveRegRegCommand> *)local_58);
    }
    pCVar5 = CBinopExpression::getRightOperand((CBinopExpression *)leftRegisterPtr);
    if (pCVar5 == (CExpression *)0x0) {
      local_1f0 = (CTempExpression *)0x0;
    }
    else {
      local_1f0 = (CTempExpression *)
                  __dynamic_cast(pCVar5,&CExpression::typeinfo,&CTempExpression::typeinfo,0);
    }
    pCVar3 = children_local;
    pCVar1 = binopPtr;
    if (local_1f0 == (CTempExpression *)0x0) {
      CTemp::CTemp((CTemp *)local_128);
      pAVar2 = commands_local;
      local_180 = CBinopExpression::getRightOperand((CBinopExpression *)leftRegisterPtr);
      std::make_pair<IRT::CTemp&,IRT::CExpression_const*>(&local_178,(CTemp *)local_128,&local_180);
      std::pair<IRT::CTemp,_const_IRT::INode_*>::pair<IRT::CTemp,_const_IRT::CExpression_*,_true>
                (&local_150,&local_178);
      std::
      vector<std::pair<IRT::CTemp,_const_IRT::INode_*>,_std::allocator<std::pair<IRT::CTemp,_const_IRT::INode_*>_>_>
      ::push_back((vector<std::pair<IRT::CTemp,_const_IRT::INode_*>,_std::allocator<std::pair<IRT::CTemp,_const_IRT::INode_*>_>_>
                   *)pAVar2,&local_150);
      std::pair<IRT::CTemp,_const_IRT::INode_*>::~pair(&local_150);
      std::pair<IRT::CTemp,_const_IRT::CExpression_*>::~pair(&local_178);
      pCVar1 = binopPtr;
      std::make_shared<AssemblyCode::SubRegRegCommand,IRT::CTemp_const&,IRT::CTemp&>
                ((CTemp *)local_190,(CTemp *)children_local);
      std::
      vector<std::shared_ptr<AssemblyCode::AssemblyCommand>,std::allocator<std::shared_ptr<AssemblyCode::AssemblyCommand>>>
      ::emplace_back<std::shared_ptr<AssemblyCode::SubRegRegCommand>>
                ((vector<std::shared_ptr<AssemblyCode::AssemblyCommand>,std::allocator<std::shared_ptr<AssemblyCode::AssemblyCommand>>>
                  *)pCVar1,(shared_ptr<AssemblyCode::SubRegRegCommand> *)local_190);
      std::shared_ptr<AssemblyCode::SubRegRegCommand>::~shared_ptr
                ((shared_ptr<AssemblyCode::SubRegRegCommand> *)local_190);
      CTemp::~CTemp((CTemp *)local_128);
    }
    else {
      CTempExpression::getTemprorary(local_1f0);
      std::make_shared<AssemblyCode::SubRegRegCommand,IRT::CTemp_const&,IRT::CTemp_const&>
                ((CTemp *)&rightRegister.field_0x18,(CTemp *)pCVar3);
      std::
      vector<std::shared_ptr<AssemblyCode::AssemblyCommand>,std::allocator<std::shared_ptr<AssemblyCode::AssemblyCommand>>>
      ::emplace_back<std::shared_ptr<AssemblyCode::SubRegRegCommand>>
                ((vector<std::shared_ptr<AssemblyCode::AssemblyCommand>,std::allocator<std::shared_ptr<AssemblyCode::AssemblyCommand>>>
                  *)pCVar1,(shared_ptr<AssemblyCode::SubRegRegCommand> *)&rightRegister.field_0x18);
      std::shared_ptr<AssemblyCode::SubRegRegCommand>::~shared_ptr
                ((shared_ptr<AssemblyCode::SubRegRegCommand> *)&rightRegister.field_0x18);
    }
    return true;
  }
  return false;
}

Assistant:

bool IRT::RegMinusRegPattern::TryToGenerateCode( const IRT::INode *tree, const IRT::CTemp &dest,
                                                 ChildrenTemps &children, AssemblyCommands &commands ) {
    ConstBinopPtr binopPtr = dynamic_cast<ConstBinopPtr>(tree);
    if ( binopPtr && binopPtr->getOperation( ) == IRT::enums::TOperationType::MINUS ) {
        ConstTempPtr leftRegisterPtr = dynamic_cast<ConstTempPtr>(binopPtr->getLeftOperand( ));
        if ( leftRegisterPtr ) {
            commands.emplace_back(
                    std::make_shared<AssemblyCode::MoveRegRegCommand>( dest, leftRegisterPtr->getTemprorary( )));
        } else {
            CTemp leftRegister;
            children.push_back( std::make_pair( leftRegister, binopPtr->getLeftOperand( )));
            commands.emplace_back( std::make_shared<AssemblyCode::MoveRegRegCommand>( dest, leftRegister ));
        }
        ConstTempPtr rightRegisterPtr = dynamic_cast<ConstTempPtr>(binopPtr->getRightOperand( ));
        if ( rightRegisterPtr ) {
            commands.emplace_back(
                    std::make_shared<AssemblyCode::SubRegRegCommand>( dest, rightRegisterPtr->getTemprorary( )));
        } else {
            CTemp rightRegister;
            children.push_back( std::make_pair( rightRegister, binopPtr->getRightOperand( )));
            commands.emplace_back( std::make_shared<AssemblyCode::SubRegRegCommand>( dest, rightRegister ));
        }
        return true;
    }
    return false;
}